

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

_binbuf * glist_writetobinbuf(_glist *x,int wholething)

{
  uint uVar1;
  t_gobj *ptVar2;
  t_dataslot *ptVar3;
  undefined8 uVar4;
  t_symbol **pptVar5;
  int iVar6;
  _binbuf *x_00;
  t_symbol *ptVar7;
  t_template *ptVar8;
  t_symbol *ptVar9;
  ulong uVar10;
  _gobj **pp_Var11;
  t_gobj **pptVar12;
  long lVar13;
  int ntemplates;
  t_symbol **templatevec;
  uint local_6c;
  _glist *local_68;
  t_symbol **local_60;
  long local_58;
  _gobj **local_50;
  ulong local_48;
  ulong local_40;
  t_symbol **local_38;
  
  local_38 = (t_symbol **)getbytes(0);
  local_6c = 0;
  x_00 = binbuf_new();
  pptVar12 = &x->gl_list;
  local_68 = x;
  local_50 = pptVar12;
  while (ptVar2 = *pptVar12, ptVar2 != (t_gobj *)0x0) {
    if ((ptVar2->g_pd == scalar_class) &&
       ((wholething != 0 || (iVar6 = glist_isselected(local_68,ptVar2), iVar6 != 0)))) {
      canvas_addtemplatesforscalar
                ((t_symbol *)ptVar2[1].g_pd,(t_word *)&ptVar2[1].g_next,(int *)&local_6c,&local_38);
    }
    pptVar12 = &ptVar2->g_next;
  }
  ptVar7 = gensym("data");
  binbuf_addv(x_00,"s;",ptVar7);
  local_58 = (long)(int)local_6c;
  local_60 = local_38;
  local_48 = 0;
  if (0 < (int)local_6c) {
    local_48 = (ulong)local_6c;
  }
  uVar10 = 0;
  while (pptVar5 = local_60, uVar10 != local_48) {
    ptVar8 = template_findbyname(local_60[uVar10]);
    uVar1 = ptVar8->t_n;
    ptVar7 = gensym("template");
    local_40 = uVar10;
    ptVar9 = gensym(pptVar5[uVar10]->s_name + 3);
    binbuf_addv(x_00,"ss;",ptVar7,ptVar9);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (lVar13 = 0; (ulong)uVar1 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
      ptVar7 = &s_float;
      switch(*(undefined4 *)((long)&ptVar8->t_vec->ds_type + lVar13)) {
      case 0:
        break;
      case 1:
        ptVar7 = &s_symbol;
        break;
      case 2:
        ptVar7 = &s_list;
        break;
      case 3:
        ptVar7 = gensym("array");
        break;
      default:
        bug("canvas_write");
        ptVar7 = &s_float;
      }
      ptVar3 = ptVar8->t_vec;
      uVar4 = *(undefined8 *)((long)&ptVar3->ds_name + lVar13);
      if (*(int *)((long)&ptVar3->ds_type + lVar13) == 3) {
        ptVar9 = gensym((char *)(**(long **)((long)&ptVar3->ds_arraytemplate + lVar13) + 3));
        binbuf_addv(x_00,"sss;",ptVar7,uVar4,ptVar9);
      }
      else {
        binbuf_addv(x_00,"ss;",ptVar7,uVar4);
      }
    }
    binbuf_addsemi(x_00);
    uVar10 = local_40 + 1;
  }
  binbuf_addsemi(x_00);
  pp_Var11 = local_50;
  while (ptVar2 = *pp_Var11, ptVar2 != (t_gobj *)0x0) {
    if ((ptVar2->g_pd == scalar_class) &&
       ((wholething != 0 || (iVar6 = glist_isselected(local_68,ptVar2), iVar6 != 0)))) {
      canvas_writescalar((t_symbol *)ptVar2[1].g_pd,(t_word *)&ptVar2[1].g_next,x_00,0);
    }
    pp_Var11 = &ptVar2->g_next;
  }
  freebytes(local_60,local_58 << 3);
  return x_00;
}

Assistant:

t_binbuf *glist_writetobinbuf(t_glist *x, int wholething)
{
    int i;
    t_symbol **templatevec = getbytes(0);
    int ntemplates = 0;
    t_gobj *y;
    t_binbuf *b = binbuf_new();

    for (y = x->gl_list; y; y = y->g_next)
    {
        if ((pd_class(&y->g_pd) == scalar_class) &&
            (wholething || glist_isselected(x, y)))
        {
            canvas_addtemplatesforscalar(((t_scalar *)y)->sc_template,
                ((t_scalar *)y)->sc_vec,  &ntemplates, &templatevec);
        }
    }
    binbuf_addv(b, "s;", gensym("data"));
    for (i = 0; i < ntemplates; i++)
    {
        t_template *template = template_findbyname(templatevec[i]);
        int j, m = template->t_n;
            /* drop "pd-" prefix from template symbol to print it: */
        binbuf_addv(b, "ss;", gensym("template"),
            gensym(templatevec[i]->s_name + 3));
        for (j = 0; j < m; j++)
        {
            t_symbol *type;
            switch (template->t_vec[j].ds_type)
            {
                case DT_FLOAT: type = &s_float; break;
                case DT_SYMBOL: type = &s_symbol; break;
                case DT_ARRAY: type = gensym("array"); break;
                case DT_TEXT: type = &s_list; break;
                default: type = &s_float; bug("canvas_write");
            }
            if (template->t_vec[j].ds_type == DT_ARRAY)
                binbuf_addv(b, "sss;", type, template->t_vec[j].ds_name,
                    gensym(template->t_vec[j].ds_arraytemplate->s_name + 3));
            else binbuf_addv(b, "ss;", type, template->t_vec[j].ds_name);
        }
        binbuf_addsemi(b);
    }
    binbuf_addsemi(b);
        /* now write out the objects themselves */
    for (y = x->gl_list; y; y = y->g_next)
    {
        if ((pd_class(&y->g_pd) == scalar_class) &&
            (wholething || glist_isselected(x, y)))
        {
            canvas_writescalar(((t_scalar *)y)->sc_template,
                ((t_scalar *)y)->sc_vec,  b, 0);
        }
    }
    t_freebytes(templatevec, ntemplates*sizeof(*templatevec));
    return (b);
}